

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O0

void uo_tcp_conn_send(uo_cb *cb)

{
  int wfd_00;
  uo_tcp_conn *tcp_conn_00;
  size_t sVar1;
  size_t sStack_30;
  int wfd;
  size_t len;
  uchar *p;
  size_t wlen;
  uo_tcp_conn *tcp_conn;
  uo_cb *cb_local;
  
  tcp_conn_00 = (uo_tcp_conn *)uo_cb_stack_index(cb,0);
  len = (size_t)tcp_conn_00->wbuf;
  sStack_30 = uo_buf_get_len_before_ptr((uo_buf)len);
  wfd_00 = tcp_conn_00->sockfd;
  while( true ) {
    if (sStack_30 == 0) {
      uo_cb_append_cb(cb,tcp_conn_00->evt_handlers->after_send);
      uo_cb_append_func(cb,uo_tcp_conn_after_send);
      uo_cb_append_func(cb,uo_tcp_conn_advance);
      uo_cb_invoke(cb);
      return;
    }
    sVar1 = uo_io_write(wfd_00,(void *)len,sStack_30);
    if (sVar1 == 0) break;
    sStack_30 = sStack_30 - sVar1;
    len = sVar1 + len;
  }
  uo_cb_stack_pop(cb);
  uo_tcp_conn_next_close(tcp_conn_00);
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void uo_tcp_conn_send(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    size_t wlen;
    unsigned char *p = tcp_conn->wbuf;
    size_t len = uo_buf_get_len_before_ptr(p);
    int wfd = tcp_conn->sockfd;

    while (len)
    {
        // TODO: handle errors properly
        if ((wlen = uo_io_write(wfd, p, len)) == 0)
        {
            uo_cb_stack_pop(cb); // remove error code
            uo_tcp_conn_next_close(tcp_conn);
            uo_cb_invoke(cb);
            return;
        }

        len -= wlen;
        p += wlen;
    }

    uo_cb_append(cb, tcp_conn->evt_handlers->after_send);
    uo_cb_append(cb, uo_tcp_conn_after_send);
    uo_cb_append(cb, uo_tcp_conn_advance);

    uo_cb_invoke(cb);
}